

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QListView::resizeEvent(QListView *this,QResizeEvent *e)

{
  QAbstractItemViewPrivate *this_00;
  undefined4 in_EAX;
  uint uVar1;
  State SVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (this_00->delayedPendingLayout == false) {
    iVar7 = -(uint)((int)*(undefined8 *)(e + 0x18) == (int)*(undefined8 *)(e + 0x10));
    iVar8 = -(uint)((int)((ulong)*(undefined8 *)(e + 0x18) >> 0x20) ==
                   (int)((ulong)*(undefined8 *)(e + 0x10) >> 0x20));
    auVar6._4_4_ = iVar7;
    auVar6._0_4_ = iVar7;
    auVar6._8_4_ = iVar8;
    auVar6._12_4_ = iVar8;
    uVar1 = movmskpd(in_EAX,auVar6);
    bVar4 = (byte)uVar1 >> 1;
    if (((byte)uVar1 & bVar4 & 1) == 0) {
      if (*(int *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                   super_QWidgetPrivate.field_0x28 == 0) {
        cVar3 = this_00->wrapItemText;
      }
      else {
        cVar3 = '\0';
      }
      iVar7 = *(int *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                       super_QWidgetPrivate.field_0x18;
      uVar5 = (uint)bVar4;
      if ((iVar7 != 1) && (uVar5 = 1, iVar7 == 0)) {
        uVar5 = uVar1;
      }
      if (cVar3 == '\0') {
        SVar2 = QAbstractItemView::state((QAbstractItemView *)this);
        if ((SVar2 != NoState) ||
           ((uVar5 & 1) != 0 ||
            *(int *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                     super_QWidgetPrivate.field_0x20 != 1)) {
          QAbstractItemView::resizeEvent((QAbstractItemView *)this,e);
          return;
        }
      }
      QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,100);
      return;
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }